

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

endpoint_type * __thiscall
asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
          (endpoint_type *__return_storage_ptr__,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *this)

{
  service_type *this_00;
  implementation_type *impl;
  undefined1 local_28 [8];
  error_code ec;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *this_local;
  endpoint_type *ep;
  
  ec._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)local_28);
  this_00 = detail::
            io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
            ::get_service(&this->impl_);
  impl = detail::
         io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
         ::get_implementation(&this->impl_);
  detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
            (__return_storage_ptr__,this_00,impl,(error_code *)local_28);
  detail::throw_error((error_code *)local_28,"remote_endpoint");
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint() const
  {
    asio::error_code ec;
    endpoint_type ep = impl_.get_service().remote_endpoint(
        impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "remote_endpoint");
    return ep;
  }